

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

QModelIndex * __thiscall
QCompletionModel::currentIndex
          (QModelIndex *__return_storage_ptr__,QCompletionModel *this,bool sourceIndex)

{
  QCompletionEngine *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  int local_38;
  int local_34;
  undefined8 local_30;
  QCompletionModel *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QCompletionEngine::matchCount((this->engine).d);
  if (iVar2 == 0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_005d0d40;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
  else {
    pQVar1 = (this->engine).d;
    local_38 = pQVar1->curRow;
    if (this->showAll == true) {
      if ((pQVar1->curMatch).indices.v == true) {
        local_38 = (pQVar1->curMatch).indices.vector.d.ptr[local_38];
      }
      else {
        local_38 = local_38 + (pQVar1->curMatch).indices.f;
      }
    }
    local_34 = this->c->column;
    local_30 = 0;
    local_28 = this;
    if (sourceIndex) {
      (**(code **)(*(long *)this + 400))(__return_storage_ptr__,this,&local_38);
    }
    else {
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)this;
      __return_storage_ptr__->r = local_38;
      __return_storage_ptr__->c = local_34;
      __return_storage_ptr__->i = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_005d0d40:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QCompletionModel::currentIndex(bool sourceIndex) const
{
    if (!engine->matchCount())
        return QModelIndex();

    int row = engine->curRow;
    if (showAll)
        row = engine->curMatch.indices[engine->curRow];

    QModelIndex idx = createIndex(row, c->column);
    if (!sourceIndex)
        return idx;
    return mapToSource(idx);
}